

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O3

void record_render_passes2(StateRecorder *recorder)

{
  bool bVar1;
  VkSubpassDescription2 subpasses [2];
  VkAttachmentReferenceStencilLayout attachment_ref_stencil_layout;
  VkRenderPassCreationControlEXT creation_control;
  VkAttachmentReference2 attachment_ref_shading_rate;
  VkAttachmentReference2 ds_resolve_ref;
  VkRenderPassCreateInfo2 local_328;
  undefined8 local_2d8;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined4 *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  VkSubpassDescription2 local_298;
  undefined4 local_240;
  undefined8 *local_238;
  undefined8 local_22c;
  undefined4 local_224;
  VkAttachmentReference2 *local_220;
  undefined4 local_218;
  VkAttachmentReference2 *local_210;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_148 [2];
  undefined8 *local_140;
  undefined8 local_138;
  undefined4 local_130;
  VkSubpassDependency2 local_128;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  VkAttachmentDescription2 local_98;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 *puStack_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_328.pNext = (undefined8 *)0x0;
  local_328.dependencyCount = 0;
  local_328._52_4_ = 0;
  local_328.pDependencies = (VkSubpassDependency2 *)0x0;
  local_328.subpassCount = 0;
  local_328._36_4_ = 0;
  local_328.pSubpasses = (VkSubpassDescription2 *)0x0;
  local_328.flags = 0;
  local_328.attachmentCount = 0;
  local_328.pAttachments = (VkAttachmentDescription2 *)0x0;
  local_328.correlatedViewMaskCount = 0;
  local_328._68_4_ = 0;
  local_328.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2;
  local_328._4_4_ = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_128.srcAccessMask = 0;
  local_128.dstAccessMask = 0;
  local_128.dependencyFlags = 0;
  local_128.viewOffset = 0;
  local_128.srcSubpass = 0;
  local_128.dstSubpass = 0;
  local_128.srcStageMask = 0;
  local_128.dstStageMask = 0;
  local_128.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_128._4_4_ = 0;
  local_128.pNext = (undefined8 *)0x0;
  memset(&local_298,0,0xb0);
  local_328.pAttachments = &local_98;
  local_98._4_4_ = 0;
  local_98.pNext._0_4_ = 0;
  local_98.pNext._4_4_ = 0;
  local_178 = &local_168;
  local_158 = 0x3b9d4aa300000004;
  uStack_150 = 0;
  local_168 = 0x3b9c73c9;
  uStack_160 = 0;
  puStack_58 = &local_1a8;
  local_1a8 = 0x3b9e776a;
  uStack_1a0 = 0;
  local_198 = 0x3b9e776a00000000;
  local_140 = &local_1e8;
  local_1e8 = 0x3b9e7769;
  uStack_1e0 = 0;
  local_1d8 = 0x3b9e776a;
  local_2c0 = local_148;
  local_148[0] = 0x3b9c73c9;
  local_138 = 0x3b9e776800000003;
  local_130 = 0;
  local_2d8 = 0x3b9dd359;
  local_2c8 = 0x400000008;
  local_2d0 = &local_188;
  local_188 = 0x3b9e3cd0;
  uStack_180 = 0;
  local_170 = 0x1000000008;
  local_328.correlatedViewMaskCount = 3;
  local_328.pCorrelatedViewMasks = record_render_passes2::correlated_view_masks;
  local_328.flags = 10;
  local_328.attachmentCount = 2;
  local_328.dependencyCount = 2;
  local_328.subpassCount = 2;
  local_128.sType = VK_STRUCTURE_TYPE_SUBPASS_DEPENDENCY_2;
  local_128.srcSubpass = 9;
  local_128.dstSubpass = 0x13;
  local_128.srcStageMask = 10;
  local_128.dstStageMask = 199;
  local_128.srcAccessMask = 0x22;
  local_128.dstAccessMask = 0x31;
  local_128.dependencyFlags = 1;
  local_128.viewOffset = -4;
  local_e8 = 0xbe0000005a;
  uStack_e0 = 0x7c600000064;
  local_d8 = 0x1ea00000154;
  uStack_d0 = 0x600000013;
  local_98.sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
  local_98.flags = 0x28;
  local_98.format = VK_FORMAT_R16G16_SFLOAT;
  local_98.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_98._52_4_ = 0;
  local_98.initialLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  local_98.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  local_98.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  local_98.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  local_98.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  local_98.samples = VK_SAMPLE_COUNT_16_BIT;
  uStack_30 = 2;
  uStack_40 = 0;
  local_38 = 0x700000000;
  uStack_60 = 0x3b9c73c8;
  uStack_5c = 0;
  local_48 = 0x10;
  uStack_50 = 0x8200000028;
  local_328.pSubpasses = &local_298;
  local_328.pDependencies = &local_128;
  if (record_render_passes2(Fossilize::StateRecorder&)::ds == '\0') {
    record_render_passes2();
  }
  local_298.sType = VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_2;
  local_298.preserveAttachmentCount = 4;
  local_298.pPreserveAttachments = record_render_passes2::preserves;
  local_298.inputAttachmentCount = 2;
  local_298.pInputAttachments = record_render_passes2::inputs;
  local_298.colorAttachmentCount = 2;
  local_298.pColorAttachments = record_render_passes2::colors;
  local_298.pipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
  local_298.viewMask = 0xf;
  local_298.pDepthStencilAttachment = &record_render_passes2::ds;
  local_298.pResolveAttachments = record_render_passes2::resolves;
  local_240 = 0x3b9c73ca;
  local_224 = 1;
  local_220 = record_render_passes2::inputs;
  local_218 = 2;
  local_210 = record_render_passes2::colors;
  local_22c = 0x700000000;
  local_238 = &local_2d8;
  local_2b8 = 0x3ba086c2;
  uStack_2b0 = 0;
  local_2a8 = 0x400000001;
  bVar1 = Fossilize::StateRecorder::record_render_pass2
                    (recorder,(VkRenderPass)&DAT_00009c40,&local_328,0);
  if (bVar1) {
    local_298.pNext = &local_2b8;
    bVar1 = Fossilize::StateRecorder::record_render_pass2
                      (recorder,(VkRenderPass)&DAT_00009c42,&local_328,0);
    if (bVar1) {
      local_128.pNext = &local_c8;
      uStack_c0 = 0;
      local_c8 = 0x3b9f9490;
      local_b8 = 0xa00000000;
      local_b0 = 0x22;
      local_a8 = 0xc700000000;
      local_a0 = 0x31;
      bVar1 = Fossilize::StateRecorder::record_render_pass2
                        (recorder,(VkRenderPass)&DAT_00009c41,&local_328,0);
      if (bVar1) {
        local_328.pNext = &local_1c8;
        local_1c8 = 0x3ba1c711;
        uStack_1c0 = 0;
        local_1b8 = 1;
        bVar1 = Fossilize::StateRecorder::record_render_pass2
                          (recorder,(VkRenderPass)&DAT_00009c42,&local_328,0);
        if (bVar1) {
          return;
        }
      }
    }
  }
  abort();
}

Assistant:

static void record_render_passes2(StateRecorder &recorder)
{
	VkRenderPassCreateInfo2 pass = { VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2 };

	VkSubpassDependency2 deps[2] = {};
	VkSubpassDescription2 subpasses[2] = {};
	VkAttachmentDescription2 att[2] = {};

	const VkAttachmentReference2 attachment_ref_shading_rate = {
		VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr,
		4, VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR, 0
	};

	VkAttachmentDescriptionStencilLayoutKHR attachment_desc_stencil_layout =
			{ VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT };
	attachment_desc_stencil_layout.stencilInitialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
	attachment_desc_stencil_layout.stencilFinalLayout = VK_IMAGE_LAYOUT_STENCIL_ATTACHMENT_OPTIMAL;

	VkAttachmentReferenceStencilLayout attachment_ref_stencil_layout =
			{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT };
	attachment_ref_stencil_layout.stencilLayout = VK_IMAGE_LAYOUT_STENCIL_ATTACHMENT_OPTIMAL;

	const VkAttachmentReference2 ds_resolve_ref = {
		VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, &attachment_ref_stencil_layout,
		3, VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_OPTIMAL, 0,
	};

	VkSubpassDescriptionDepthStencilResolve ds_resolve =
			{ VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE };
	ds_resolve.depthResolveMode = VK_RESOLVE_MODE_MAX_BIT;
	ds_resolve.stencilResolveMode = VK_RESOLVE_MODE_MIN_BIT;
	ds_resolve.pDepthStencilResolveAttachment = &ds_resolve_ref;

	VkFragmentShadingRateAttachmentInfoKHR shading_rate_info =
			{ VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR };
	shading_rate_info.pFragmentShadingRateAttachment = &attachment_ref_shading_rate;
	shading_rate_info.shadingRateAttachmentTexelSize.width = 8;
	shading_rate_info.shadingRateAttachmentTexelSize.height = 16;
	ds_resolve.pNext = &shading_rate_info;

	static const uint32_t correlated_view_masks[] = { 1, 4, 2 };
	pass.correlatedViewMaskCount = 3;
	pass.pCorrelatedViewMasks = correlated_view_masks;

	pass.flags = 10;
	pass.attachmentCount = 2;
	pass.pAttachments = att;
	pass.dependencyCount = 2;
	pass.pDependencies = deps;
	pass.subpassCount = 2;
	pass.pSubpasses = subpasses;

	deps[0].sType = VK_STRUCTURE_TYPE_SUBPASS_DEPENDENCY_2;
	deps[0].dependencyFlags = VK_DEPENDENCY_BY_REGION_BIT;
	deps[0].dstAccessMask = 49;
	deps[0].srcAccessMask = 34;
	deps[0].dstStageMask = 199;
	deps[0].srcStageMask = 10;
	deps[0].srcSubpass = 9;
	deps[0].dstSubpass = 19;
	deps[0].viewOffset = -4;
	deps[1].dependencyFlags = 19;
	deps[1].dstAccessMask = 490;
	deps[1].srcAccessMask = 340;
	deps[1].dstStageMask = 1990;
	deps[1].srcStageMask = 100;
	deps[1].srcSubpass = 90;
	deps[1].dstSubpass = 190;
	deps[1].viewOffset = 6;

	att[0].sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
	att[0].flags = 40;
	att[0].format = VK_FORMAT_R16G16_SFLOAT;
	att[0].finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
	att[0].initialLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
	att[0].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
	att[0].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
	att[0].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
	att[0].stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
	att[0].samples = VK_SAMPLE_COUNT_16_BIT;

	att[1] = att[0];
	att[1].format = VK_FORMAT_D32_SFLOAT_S8_UINT;
	att[1].pNext = &attachment_desc_stencil_layout;

	static const uint32_t preserves[4] = { 9, 4, 2, 3 };
	static const VkAttachmentReference2 inputs[2] = {
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 3, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL, 5 },
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 9, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, 6 }
	};
	static const VkAttachmentReference2 colors[2] = {
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 8, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL, 10 },
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 1, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, 13 }
	};
	static const VkAttachmentReference2 resolves[2] = {
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 1, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL, 20 },
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 3, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, 30 }
	};
	static const VkAttachmentReference2 ds = {
		VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, &attachment_ref_stencil_layout, 0, VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL, 40
	};
	subpasses[0].sType = VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_2;
	subpasses[0].preserveAttachmentCount = 4;
	subpasses[0].pPreserveAttachments = preserves;
	subpasses[0].inputAttachmentCount = 2;
	subpasses[0].pInputAttachments = inputs;
	subpasses[0].colorAttachmentCount = 2;
	subpasses[0].pColorAttachments = colors;
	subpasses[0].pipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
	subpasses[0].pDepthStencilAttachment = &ds;
	subpasses[0].pResolveAttachments = resolves;
	subpasses[0].viewMask = 0xf;

	subpasses[1].sType = VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_2;
	subpasses[1].inputAttachmentCount = 1;
	subpasses[1].pInputAttachments = inputs;
	subpasses[1].colorAttachmentCount = 2;
	subpasses[1].pColorAttachments = colors;
	subpasses[1].pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
	subpasses[1].viewMask = 0x7;
	subpasses[1].pNext = &ds_resolve;

	VkMultisampledRenderToSingleSampledInfoEXT ms2ss =
			{ VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT };
	ms2ss.rasterizationSamples = VK_SAMPLE_COUNT_4_BIT;
	ms2ss.multisampledRenderToSingleSampledEnable = VK_TRUE;

	if (!recorder.record_render_pass2(fake_handle<VkRenderPass>(40000), pass))
		abort();

	subpasses[0].pNext = &ms2ss;
	if (!recorder.record_render_pass2(fake_handle<VkRenderPass>(40002), pass))
		abort();

	VkMemoryBarrier2KHR memory_barrier2 =
			{ VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR };
	memory_barrier2.pNext = nullptr;
	memory_barrier2.srcStageMask = 10ull << 32;
	memory_barrier2.srcAccessMask = 34;
	memory_barrier2.dstStageMask = 199ull << 32;
	memory_barrier2.dstAccessMask = 49;
	deps[0].pNext = &memory_barrier2;

	if (!recorder.record_render_pass2(fake_handle<VkRenderPass>(40001), pass))
		abort();

	VkRenderPassCreationControlEXT creation_control =
			{ VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT };
	creation_control.disallowMerging = VK_TRUE;
	pass.pNext = &creation_control;
	if (!recorder.record_render_pass2(fake_handle<VkRenderPass>(40002), pass))
		abort();
}